

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepTiledInputFile::readTiles
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  LineOrder LVar1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  pointer ppTVar3;
  TileBuffer *pTVar4;
  InputStreamMutex *pIVar5;
  Int64 IVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int n;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Int64 *pIVar16;
  Int64 IVar17;
  undefined4 extraout_var_00;
  Task *this_00;
  InputExc *pIVar18;
  ostream *poVar19;
  ArgExc *pAVar20;
  IoExc *this_01;
  long lVar21;
  long lVar22;
  int dx;
  string *psVar23;
  string *text;
  void *pvVar24;
  int dy;
  ulong uVar25;
  char *text_00;
  stringstream _iex_throw_s;
  TaskGroup taskGroup;
  int local_340;
  undefined4 uStack_33c;
  ostream local_330 [376];
  TaskGroup local_1b8 [49];
  undefined4 extraout_var;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar13 = pthread_mutex_lock(__mutex);
  if (iVar13 != 0) {
    std::__throw_system_error(iVar13);
  }
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar20,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  if ((((ly | lx) < 0) ||
      (((lx != ly && ((pDVar2->tileDesc).mode == MIPMAP_LEVELS)) || (pDVar2->numXLevels <= lx)))) ||
     (pDVar2->numYLevels <= ly)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,"Level coordinate (",0x12);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,lx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,") is invalid.",0xd);
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&local_340);
    __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  iVar13 = dx2;
  if (dx2 < dx1) {
    iVar13 = dx1;
  }
  if (dx1 < dx2) {
    dx2 = dx1;
  }
  dy = dy2;
  if (dy1 < dy2) {
    dy = dy1;
  }
  if (dy2 < dy1) {
    dy2 = dy1;
  }
  LVar1 = pDVar2->lineOrder;
  iVar8 = dy + -1;
  if (LVar1 != DECREASING_Y) {
    iVar8 = dy2 + 1;
  }
  IlmThread_2_5::TaskGroup::TaskGroup(local_1b8);
  if (LVar1 == DECREASING_Y) {
    dy = dy2;
  }
  if (dy != iVar8) {
    iVar14 = 0;
    do {
      uVar25 = (ulong)iVar14;
      iVar14 = ((iVar13 + 1) - dx2) + iVar14;
      dx = dx2;
      do {
        bVar12 = isValidTile(this,dx,dy,lx,ly);
        if (!bVar12) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,"Tile (",6);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,dx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,dy);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,",",1);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,") is not a valid tile.",0x16);
          pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&local_340);
          __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        pDVar2 = this->_data;
        ppTVar3 = (pDVar2->tileBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar24 = (void *)((long)(pDVar2->tileBuffers).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3);
        pTVar4 = ppTVar3[uVar25 % (ulong)pvVar24];
        IlmThread_2_5::Semaphore::wait
                  ((Semaphore *)((long)&(pTVar4->_sem)._semaphore + 0x18),pvVar24);
        *(int *)((long)&(pTVar4->exception)._M_string_length + 4) = dx;
        *(int *)&(pTVar4->exception).field_2 = dy;
        *(int *)((long)&(pTVar4->exception).field_2 + 4) = lx;
        *(int *)((long)&(pTVar4->exception).field_2 + 8) = ly;
        pTVar4->compressor = (Compressor *)0x0;
        pIVar5 = pDVar2->_streamData;
        pIVar16 = TileOffsets::operator()(&pDVar2->tileOffsets,dx,dy,lx,ly);
        IVar6 = *pIVar16;
        if (IVar6 == 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,"Tile (",6);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,dx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,dy);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,") is missing.",0xd);
          pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar18,(stringstream *)&local_340);
          __cxa_throw(pIVar18,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        if ((pDVar2->version & 0x1000) == 0) {
          IVar17 = pIVar5->currentPosition;
        }
        else {
          iVar15 = (*pIVar5->is->_vptr_IStream[5])();
          IVar17 = CONCAT44(extraout_var,iVar15);
        }
        if (IVar17 != IVar6) {
          (*pIVar5->is->_vptr_IStream[6])(pIVar5->is,IVar6);
        }
        if (((pDVar2->version & 0x1000) != 0) &&
           ((*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4),
           local_340 != pDVar2->partNumber)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_330,"Unexpected part number ",0x17);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_330,local_340);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,", should be ",0xc);
          poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,pDVar2->partNumber);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,".",1);
          pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&local_340);
          __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4);
        iVar15 = local_340;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4);
        iVar9 = local_340;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4);
        iVar10 = local_340;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,4);
        iVar11 = local_340;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,8);
        n = local_340;
        lVar21 = CONCAT44(uStack_33c,local_340);
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,8);
        pTVar4->dy = local_340;
        pTVar4->lx = uStack_33c;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&local_340,8);
        pTVar4->ly = local_340;
        pTVar4->hasException = (bool)(char)uStack_33c;
        *(int3 *)&pTVar4->field_0x35 = (int3)((uint)uStack_33c >> 8);
        Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar5->is,n);
        if (dx != iVar15) {
          text_00 = "Unexpected tile x coordinate.";
LAB_00471850:
          pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar18,text_00);
          __cxa_throw(pIVar18,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        if (iVar9 != dy) {
          text_00 = "Unexpected tile y coordinate.";
          goto LAB_00471850;
        }
        if (iVar10 != lx) {
          text_00 = "Unexpected tile x level number coordinate.";
          goto LAB_00471850;
        }
        if (iVar11 != ly) {
          text_00 = "Unexpected tile y level number coordinate.";
          goto LAB_00471850;
        }
        iVar15 = (*pIVar5->is->_vptr_IStream[2])();
        if ((char)iVar15 == '\0') {
          if (*(void **)&pTVar4->format != (void *)0x0) {
            operator_delete__(*(void **)&pTVar4->format);
          }
          uVar7._0_4_ = pTVar4->dy;
          uVar7._4_4_ = pTVar4->lx;
          pvVar24 = operator_new__(uVar7);
          *(void **)&pTVar4->format = pvVar24;
          (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,pvVar24,uVar7 & 0xffffffff);
        }
        else {
          iVar15 = (*pIVar5->is->_vptr_IStream[4])(pIVar5->is,(ulong)(uint)pTVar4->dy);
          pTVar4->format = iVar15;
          pTVar4->dx = extraout_var_00;
        }
        pIVar5->currentPosition = *(long *)&pTVar4->dy + 0x28 + IVar6 + lVar21;
        this_00 = (Task *)operator_new(0x20);
        IlmThread_2_5::Task::Task(this_00,local_1b8);
        this_00->_vptr_Task = (_func_int **)&PTR__TileBufferTask_0303d3a0;
        this_00[1]._vptr_Task = (_func_int **)pDVar2;
        this_00[1]._group = (TaskGroup *)pTVar4;
        IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
        dx = dx + 1;
        uVar25 = uVar25 + 1;
      } while (iVar13 + 1 != dx);
      dy = dy + (uint)(LVar1 != DECREASING_Y) * 2 + -1;
    } while (dy != iVar8);
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(local_1b8);
  ppTVar3 = (this->_data->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar21 = (long)(this->_data->tileBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3;
  if (lVar21 != 0) {
    lVar21 = lVar21 >> 3;
    lVar22 = 0;
    psVar23 = (string *)0x0;
    do {
      pTVar4 = ppTVar3[lVar22];
      text = (string *)&pTVar4->_sem;
      if (psVar23 != (string *)0x0) {
        text = psVar23;
      }
      if ((pTVar4->exception).field_2._M_local_buf[0xc] == '\0') {
        text = psVar23;
      }
      (pTVar4->exception).field_2._M_local_buf[0xc] = '\0';
      lVar22 = lVar22 + 1;
      psVar23 = text;
    } while (lVar21 + (ulong)(lVar21 == 0) != lVar22);
    if (text != (string *)0x0) {
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::IoExc::IoExc(this_01,text);
      __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepTiledInputFile::readTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data destination.");

        if (!isValidLevel (lx, ly))
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");

        //
        // Determine the first and last tile coordinates in both dimensions.
        // We always attempt to read the range of tiles in the order that
        // they are stored in the file.
        //

        if (dx1 > dx2)
            std::swap (dx1, dx2);

        if (dy1 > dy2)
            std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;
            int tileNumber = 0;

            for (int dy = dyStart; dy != dyStop; dy += dY)
            {
                for (int dx = dx1; dx <= dx2; dx++)
                {
                    if (!isValidTile (dx, dy, lx, ly))
                        THROW (IEX_NAMESPACE::ArgExc,
                               "Tile (" << dx << ", " << dy << ", " <<
                               lx << "," << ly << ") is not a valid tile.");

                    ThreadPool::addGlobalTask (newTileBufferTask (&taskGroup,
                                                                  _data,
                                                                  tileNumber++,
                                                                  dx, dy,
                                                                  lx, ly));
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledInputFile::readTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size(); ++i)
        {
            TileBuffer *tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}